

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O2

void __thiscall trng::truncated_normal_dist<float>::param_type::update_Phi(param_type *this)

{
  result_type_conflict1 rVar1;
  
  if (this->a_ == -INFINITY) {
    rVar1 = 0.0;
  }
  else {
    rVar1 = math::Phi((this->a_ - this->mu_) / this->sigma_);
  }
  this->Phi_a = rVar1;
  if (this->b_ == INFINITY) {
    rVar1 = 1.0;
  }
  else {
    rVar1 = math::Phi((this->b_ - this->mu_) / this->sigma_);
  }
  this->Phi_b = rVar1;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
      void update_Phi() {
        if (a_ > -math::numeric_limits<result_type>::infinity())
          Phi_a = math::Phi((a_ - mu_) / sigma_);
        else
          Phi_a = result_type(0);
        if (b_ < math::numeric_limits<result_type>::infinity())
          Phi_b = math::Phi((b_ - mu_) / sigma_);
        else
          Phi_b = result_type(1);
      }